

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int get_pattr(attr_list list,int index,atom_t *name,attr_value_type *val_type,attr_union *value)

{
  attr_union *paVar1;
  attr_list list_00;
  int_attr_struct *piVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  
  if (list->list_of_lists == 0) {
    piVar2 = (list->l).list.iattrs;
    lVar5 = (long)index;
    if (index < (int)(uint)piVar2->int_attr_count) {
      *name = piVar2->iattr[lVar5].attr_id;
      *val_type = Attr_Int4;
      (value->u).f = (float)((list->l).list.iattrs)->iattr[lVar5].value;
    }
    else {
      lVar5 = lVar5 - (ulong)piVar2->int_attr_count;
      if ((int)(uint)piVar2->other_attr_count <= (int)lVar5) goto LAB_00104724;
      *name = (list->l).list.attributes[lVar5].attr_id;
      *val_type = (list->l).list.attributes[lVar5].val_type;
      paVar1 = &(list->l).list.attributes[lVar5].value;
      pvVar3 = (paVar1->u).o.buffer;
      (value->u).d = (paVar1->u).d;
      (value->u).o.buffer = pvVar3;
    }
    iVar4 = 1;
  }
  else {
    if (0 < (list->l).lists.sublist_count) {
      lVar5 = 0;
      do {
        list_00 = (list->l).lists.lists[lVar5];
        iVar4 = attr_count(list_00);
        if (index < iVar4) {
          iVar4 = get_pattr(list_00,index,name,val_type,value);
          return iVar4;
        }
        lVar5 = lVar5 + 1;
        index = index - iVar4;
      } while (lVar5 < (list->l).lists.sublist_count);
    }
LAB_00104724:
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
get_pattr(attr_list list,int index, atom_t *name,
	  attr_value_type *val_type, attr_union *value)
{
    if (!list->list_of_lists) {
	if (index < list->l.list.iattrs->int_attr_count) {
	    *name = list->l.list.iattrs->iattr[index].attr_id;
	    *val_type = Attr_Int4;
	    value->u.i = list->l.list.iattrs->iattr[index].value;
	    return 1;
	}
	index -= list->l.list.iattrs->int_attr_count;
	if (index < list->l.list.iattrs->other_attr_count) {
	    *name = list->l.list.attributes[index].attr_id;
	    *val_type = list->l.list.attributes[index].val_type;
	    *value = list->l.list.attributes[index].value;
	    return 1;
	}
	return 0;
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            int count = attr_count(list->l.lists.lists[i]);
            if (index < count) {
                return get_pattr(list->l.lists.lists[i], index, name, 
				val_type, value);
            } else {
                index -= count;
            }
        }
        return 0;
    }   
}